

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O0

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::ProceduralDeassignStatement>
          (ASTSerializer *this,ProceduralDeassignStatement *elem,bool inMembersArray)

{
  bool bVar1;
  SourceLocation this_00;
  size_t sVar2;
  byte in_DL;
  long in_RSI;
  ASTSerializer *in_RDI;
  string_view sVar3;
  AttributeSymbol *attr;
  iterator __end0;
  iterator __begin0;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *__range5;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes;
  SourceLocation end;
  SourceLocation start;
  SourceRange sr;
  SourceManager *sm;
  Compilation *in_stack_fffffffffffffe88;
  Compilation *in_stack_fffffffffffffe90;
  ASTSerializer *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
  in_stack_fffffffffffffeb0;
  ASTSerializer *in_stack_fffffffffffffeb8;
  SourceManager *in_stack_fffffffffffffec0;
  SourceLocation in_stack_fffffffffffffec8;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> local_130;
  SyntaxNode *in_stack_fffffffffffffee0;
  int local_110;
  group_type_pointer local_108;
  SourceManager *in_stack_ffffffffffffff00;
  SourceLocation in_stack_ffffffffffffff08;
  void *local_f0;
  SourceManager *in_stack_ffffffffffffff18;
  int __fd;
  SourceLocation in_stack_ffffffffffffff20;
  SourceLocation in_stack_ffffffffffffff28;
  int local_c8;
  void *local_c0;
  int local_b0;
  void *local_a8;
  size_t local_98;
  int local_88;
  void *local_80;
  size_t local_70;
  int local_60;
  void *local_58;
  SourceRange local_30;
  Compilation *local_20;
  byte local_11;
  long local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  JsonWriter::startObject((JsonWriter *)in_stack_fffffffffffffeb0._M_current);
  if (((*(long *)(local_10 + 8) != 0) && ((in_RDI->includeSourceInfo & 1U) != 0)) &&
     (local_20 = (Compilation *)Compilation::getSourceManager(in_RDI->compilation),
     local_20 != (Compilation *)0x0)) {
    local_30 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffee0);
    in_stack_fffffffffffffe88 = local_20;
    SourceRange::start(&local_30);
    SourceManager::getFullyExpandedLoc(in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
    in_stack_fffffffffffffe90 = local_20;
    SourceRange::end(&local_30);
    this_00 = SourceManager::getFullyExpandedLoc
                        (in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0,
               (char *)in_RDI);
    sVar3 = SourceManager::getFileName(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    local_70 = sVar3._M_len;
    write(in_RDI,local_60,local_58,local_70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0,
               (char *)in_RDI);
    sVar3 = SourceManager::getFileName(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    local_98 = sVar3._M_len;
    write(in_RDI,local_88,local_80,local_98);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0,
               (char *)in_RDI);
    sVar2 = SourceManager::getLineNumber
                      ((SourceManager *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
    write(in_RDI,local_b0,local_a8,sVar2);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0,
               (char *)in_RDI);
    sVar2 = SourceManager::getLineNumber
                      ((SourceManager *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
    __fd = in_stack_ffffffffffffff20._0_4_;
    write(in_RDI,local_c8,local_c0,sVar2);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0,
               (char *)in_RDI);
    sVar2 = SourceManager::getColumnNumber(in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
    write(in_RDI,__fd,(void *)in_stack_ffffffffffffff28,sVar2);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0,
               (char *)in_RDI);
    sVar2 = SourceManager::getColumnNumber((SourceManager *)this_00,in_stack_ffffffffffffff08);
    write(in_RDI,in_stack_ffffffffffffff08._0_4_,local_f0,sVar2);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0,
             (char *)in_RDI);
  sVar3 = ast::toString(Invalid);
  write(in_RDI,local_110,local_108,sVar3._M_len);
  local_130 = Compilation::getAttributes
                        (in_stack_fffffffffffffe90,(Statement *)in_stack_fffffffffffffe88);
  bVar1 = std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::empty
                    ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                     0x4f3770);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0,
               (char *)in_RDI);
    sVar3._M_str = (char *)in_stack_fffffffffffffeb0._M_current;
    sVar3._M_len = in_stack_fffffffffffffea8;
    startArray(in_stack_fffffffffffffea0,sVar3);
    in_stack_fffffffffffffeb8 = (ASTSerializer *)&local_130;
    std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::begin
              ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
               in_stack_fffffffffffffe88);
    std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::end
              ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)in_RDI);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffe90,
                              (__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffe88), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
      ::operator*((__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                   *)&stack0xfffffffffffffeb0);
      serialize((ASTSerializer *)in_stack_fffffffffffffe90,(Symbol *)in_stack_fffffffffffffe88,false
               );
      __gnu_cxx::
      __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                    *)&stack0xfffffffffffffeb0);
    }
    endArray((ASTSerializer *)0x4f3815);
  }
  ProceduralDeassignStatement::serializeTo
            ((ProceduralDeassignStatement *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  JsonWriter::endObject((JsonWriter *)in_stack_fffffffffffffec0);
  return;
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    if constexpr (std::is_base_of_v<Expression, T> || std::is_base_of_v<Statement, T> ||
                  std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                  std::is_base_of_v<AssertionExpr, T> || std::is_base_of_v<BinsSelectExpr, T> ||
                  std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        if (elem.syntax && includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                auto sr = elem.syntax->sourceRange();
                auto start = sm->getFullyExpandedLoc(sr.start());
                auto end = sm->getFullyExpandedLoc(sr.end());
                write("source_file_start", sm->getFileName(start));
                write("source_file_end", sm->getFileName(end));
                write("source_line_start", sm->getLineNumber(start));
                write("source_line_end", sm->getLineNumber(end));
                write("source_column_start", sm->getColumnNumber(start));
                write("source_column_end", sm->getColumnNumber(end));
            }
        }
    }
    if constexpr (std::is_base_of_v<Expression, T>) {
        write("kind", toString(elem.kind));
        write("type", *elem.type);
        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        if (tryConstantFold) {
            ASTContext ctx(compilation.getRoot(), LookupLocation::max);
            ConstantValue constant = ctx.tryEval(elem);
            if (constant)
                write("constant", constant);
        }
        else if (elem.constant) {
            write("constant", *elem.constant);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        write("kind", toString(elem.kind));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            // If we're not including detailed type info, we can just write the type name,
            // unless this a type alias, class, or covergroup. Otherwise we will fall through
            // and serialize full detailed type info.
            if (!detailedTypeInfo && (!inMembersArray || (!std::is_same_v<TypeAliasType, T> &&
                                                          !std::is_same_v<ClassType, T> &&
                                                          !std::is_same_v<CovergroupType, T>))) {
                writer.writeValue(elem.toString());
                return;
            }

            // Avoid infinite loops with recursive types.
            if (!visiting.insert(&elem).second) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Skip uninstantiated blocks and instances.
        if constexpr (std::is_same_v<InstanceSymbol, T> ||
                      std::is_same_v<CheckerInstanceSymbol, T>) {
            if (elem.body.flags.has(InstanceFlags::Uninstantiated))
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockArraySymbol, T>) {
            if (!elem.valid)
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockSymbol, T>) {
            if (elem.isUninstantiated)
                return;
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::BuiltIn | MethodFlags::Randomize))
                return;
        }

        // Ignore transparent members.
        if (elem.kind == SymbolKind::TransparentMember)
            return;

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));
        if (includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                write("source_file", sm->getFileName(elem.location));
                write("source_line", sm->getLineNumber(elem.location));
                write("source_column", sm->getColumnNumber(elem.location));
            }
        }

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            if (elem.kind != SymbolKind::EnumValue)
                write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();

        if constexpr (std::is_base_of_v<Type, T>) {
            visiting.erase(&elem);
        }
    }
}